

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

CFGNode * __thiscall
dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block
          (CFGStructurizer *this,CFGNode *header,CFGNode *merge,CFGNode *path)

{
  __node_base_ptr p_Var1;
  bool bVar2;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *this_00;
  reference ppCVar3;
  pair<std::__detail::_Node_iterator<const_dxil_spv::CFGNode_*,_true,_false>,_bool> pVar4;
  bool local_102;
  ThreadLocalAllocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_e0;
  anon_class_8_1_3dd19718 local_c0;
  function<bool_(const_dxil_spv::CFGNode_*)> local_b8;
  _Node_iterator_base<const_dxil_spv::CFGNode_*,_false> local_98;
  undefined1 local_90;
  CFGNode *local_88;
  CFGNode *p;
  iterator __end1;
  iterator __begin1;
  Vector<CFGNode_*> *__range1;
  UnorderedSet<const_CFGNode_*> normal_preds;
  CFGNode *ladder;
  CFGNode *path_local;
  CFGNode *merge_local;
  CFGNode *header_local;
  CFGStructurizer *this_local;
  
  bVar2 = CFGNode::dominates(header,merge);
  local_102 = false;
  if (bVar2) {
    local_102 = CFGNode::dominates(header,path);
  }
  if (local_102 == false) {
    __assert_fail("header->dominates(merge) && header->dominates(path)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x150b,
                  "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                 );
  }
  bVar2 = query_reachability(this,merge,path);
  if (!bVar2) {
    __assert_fail("query_reachability(*merge, *path)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x150c,
                  "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                 );
  }
  bVar2 = CFGNode::dominates(merge,path);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    if (header == merge) {
      __assert_fail("header != merge",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x150e,
                    "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                   );
    }
    if (merge == path) {
      __assert_fail("merge != path",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x150f,
                    "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                   );
    }
    if (header == path) {
      __assert_fail("header != path",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x1510,
                    "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
                   );
    }
    normal_preds._M_h._M_single_bucket =
         (__node_base_ptr)create_ladder_block(this,header,merge,".transpose");
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                     *)&__range1);
    this_00 = (vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              (normal_preds._M_h._M_single_bucket + 0x28);
    __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ::begin(this_00);
    p = (CFGNode *)
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                  (this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                       *)&p), bVar2) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                ::operator*(&__end1);
      local_88 = *ppCVar3;
      pVar4 = std::
              unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
              ::insert((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                        *)&__range1,&local_88);
      local_98._M_cur =
           (__node_type *)
           pVar4.first.super__Node_iterator_base<const_dxil_spv::CFGNode_*,_false>._M_cur;
      local_90 = pVar4.second;
      __gnu_cxx::
      __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
      ::operator++(&__end1);
    }
    traverse_dominated_blocks_and_rewrite_branch
              (this,header,path,(CFGNode *)normal_preds._M_h._M_single_bucket);
    p_Var1 = normal_preds._M_h._M_single_bucket;
    local_c0.normal_preds = (UnorderedSet<const_CFGNode_*> *)&__range1;
    std::function<bool(dxil_spv::CFGNode_const*)>::
    function<dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*)::__0,void>
              ((function<bool(dxil_spv::CFGNode_const*)> *)&local_b8,&local_c0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&local_100,"transpose_ladder_phi_",&local_101);
    std::operator+(&local_e0,&local_100,
                   (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    *)normal_preds._M_h._M_single_bucket);
    rewrite_ladder_conditional_branch_from_incoming_blocks
              (this,(CFGNode *)p_Var1,path,merge,&local_b8,&local_e0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_e0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::~basic_string(&local_100);
    std::function<bool_(const_dxil_spv::CFGNode_*)>::~function(&local_b8);
    p_Var1 = normal_preds._M_h._M_single_bucket;
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::~unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                      *)&__range1);
    return (CFGNode *)p_Var1;
  }
  __assert_fail("!merge->dominates(path)",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x150d,
                "CFGNode *dxil_spv::CFGStructurizer::transpose_code_path_through_ladder_block(CFGNode *, CFGNode *, CFGNode *)"
               );
}

Assistant:

CFGNode *CFGStructurizer::transpose_code_path_through_ladder_block(
    CFGNode *header, CFGNode *merge, CFGNode *path)
{
	assert(header->dominates(merge) && header->dominates(path));
	assert(query_reachability(*merge, *path));
	assert(!merge->dominates(path));
	assert(header != merge);
	assert(merge != path);
	assert(header != path);

	// Rewrite the merge block into merge.pred where merge.pred will branch to either merge or path.
	auto *ladder = create_ladder_block(header, merge, ".transpose");

	UnorderedSet<const CFGNode *> normal_preds;
	for (auto *p : ladder->pred)
		normal_preds.insert(p);
	traverse_dominated_blocks_and_rewrite_branch(header, path, ladder);
	rewrite_ladder_conditional_branch_from_incoming_blocks(
		ladder, path, merge, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
		String("transpose_ladder_phi_") + ladder->name);
	return ladder;
}